

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,8,1,0,8,1>const,3,1,false>,float,float>
               (Matrix<float,_3,_1,_0,_3,_1> *dst,
               Block<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3,_1,_false> *src,
               assign_op<float,_float> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<float,_float> *param_2_local;
  Block<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3,_1,_false> *src_local;
  Matrix<float,_3,_1,_0,_3,_1> *dst_local;
  
  IVar1 = MapBase<Eigen::Block<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3,_1,_false>,_0>::rows
                    ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3,_1,_false>,_0>
                      *)src);
  cols = MapBase<Eigen::Block<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3,_1,_false>,_0>::cols
                   ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3,_1,_false>,_0>
                     *)src);
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>);
    if (IVar2 == cols) goto LAB_001eb9ed;
  }
  PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,IVar1,cols);
LAB_001eb9ed:
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, 3, 1>, SrcXprType = Eigen::Block<const Eigen::Matrix<float, 8, 1>, 3, 1>, T1 = float, T2 = float]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}